

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglSimpleConfigCase.cpp
# Opt level: O3

int __thiscall deqp::egl::SimpleConfigCase::init(SimpleConfigCase *this,EVP_PKEY_CTX *ctx)

{
  pointer ppvVar1;
  EGLint EVar2;
  int extraout_EAX;
  Library *egl;
  EGLDisplay display;
  pointer ppvVar3;
  NotSupportedError *this_00;
  ulong uVar4;
  vector<int,_std::allocator<int>_> configIds;
  vector<int,_std::allocator<int>_> local_1c8;
  Array<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_> local_1a8;
  undefined1 local_198 [8];
  _func_int **pp_Stack_190;
  pointer local_188;
  ios_base local_120 [264];
  
  egl = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
  display = eglu::getAndInitDisplay
                      ((((this->super_TestCase).m_eglTestCtx)->m_nativeDisplay).
                       super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>
                       .m_data.ptr,(Version *)0x0);
  this->m_display = display;
  eglu::chooseConfigs((vector<void_*,_std::allocator<void_*>_> *)local_198,egl,display,
                      &this->m_filters);
  ppvVar3 = (this->m_configs).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppvVar1 = (this->m_configs).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  (this->m_configs).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_198;
  (this->m_configs).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_finish = pp_Stack_190;
  (this->m_configs).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = local_188;
  local_198 = (undefined1  [8])0x0;
  pp_Stack_190 = (_func_int **)0x0;
  local_188 = (pointer)0x0;
  if (ppvVar3 != (pointer)0x0) {
    operator_delete(ppvVar3,(long)ppvVar1 - (long)ppvVar3);
    if (local_198 != (undefined1  [8])0x0) {
      operator_delete((void *)local_198,(long)local_188 - (long)local_198);
    }
  }
  std::vector<int,_std::allocator<int>_>::vector
            (&local_1c8,
             (long)(this->m_configs).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(this->m_configs).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3,(allocator_type *)local_198);
  ppvVar3 = (this->m_configs).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->m_configs).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppvVar3) {
    uVar4 = 0;
    do {
      EVar2 = eglu::getConfigID(egl,this->m_display,ppvVar3[uVar4]);
      local_1c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar4] = EVar2;
      uVar4 = uVar4 + 1;
      ppvVar3 = (this->m_configs).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                super__Vector_impl_data._M_start;
    } while (uVar4 < (ulong)((long)(this->m_configs).
                                   super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                                   super__Vector_impl_data._M_finish - (long)ppvVar3 >> 3));
  }
  local_198 = (undefined1  [8])
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_190);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&pp_Stack_190,"Compatible configs: ",0x14);
  local_1a8.begin._M_current =
       local_1c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start;
  local_1a8.end._M_current =
       local_1c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  tcu::Format::operator<<((ostream *)&pp_Stack_190,&local_1a8);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_190);
  std::ios_base::~ios_base(local_120);
  if (local_1c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_1c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  ppvVar3 = (this->m_configs).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppvVar3 !=
      (this->m_configs).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    (this->m_configIter)._M_current = ppvVar3;
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
               "Pass");
    return extraout_EAX;
  }
  (*egl->_vptr_Library[0x34])(egl,this->m_display);
  this->m_display = (EGLDisplay)0x0;
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this_00,"No compatible configs found",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSimpleConfigCase.cpp"
             ,0x4e);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void SimpleConfigCase::init (void)
{
	const Library&		egl		= m_eglTestCtx.getLibrary();

	DE_ASSERT(m_display == EGL_NO_DISPLAY && m_configs.empty());

	m_display	= getAndInitDisplay(m_eglTestCtx.getNativeDisplay());
	m_configs	= chooseConfigs(egl, m_display, m_filters);

	// Log matching configs.
	{
		vector<EGLint> configIds(m_configs.size());

		for (size_t ndx = 0; ndx < m_configs.size(); ndx++)
			configIds[ndx] = getConfigID(egl, m_display, m_configs[ndx]);

		m_testCtx.getLog() << TestLog::Message << "Compatible configs: " << tcu::formatArray(configIds.begin(), configIds.end()) << TestLog::EndMessage;
	}

	if (m_configs.empty())
	{
		egl.terminate(m_display);
		m_display = EGL_NO_DISPLAY;
		TCU_THROW(NotSupportedError, "No compatible configs found");
	}

	// Init config iter
	m_configIter = m_configs.begin();

	// Init test case result to Pass
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
}